

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O1

void mk_server_loop(mk_server *server)

{
  undefined8 in_RAX;
  uint64_t val;
  undefined8 local_18;
  
  local_18 = in_RAX;
  mk_utils_worker_rename("monkey: server");
  if (server->lib_mode == 0) {
    mk_print(0x1000,"HTTP Server started");
  }
  mk_sched_broadcast_signal(server,0xeeeeeeee);
  if (0 < server->lib_ch_start[1]) {
    local_18 = 0xeeeeeeee;
    write(server->lib_ch_start[1],&local_18,8);
  }
  if (server->scheduler_mode == '\x01') {
    return;
  }
  mk_server_loop_balancer(server);
  return;
}

Assistant:

void mk_server_loop(struct mk_server *server)
{
    uint64_t val;

    /* Rename worker */
    mk_utils_worker_rename("monkey: server");

    if (server->lib_mode == MK_FALSE) {
        mk_info("HTTP Server started");
    }

    /* Wake up workers */
    val = MK_SERVER_SIGNAL_START;
    mk_sched_broadcast_signal(server, val);

    /* Signal lib caller (if any) */
    mk_server_lib_notify_started(server);

    /*
     * When using REUSEPORT mode on the Scheduler, we need to signal
     * them so they can start processing connections.
     */
    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        /* do thing :) */
    }
    else {
        /* FIXME!: this old mode needs some checks on library mode */
        mk_server_loop_balancer(server);
    }
}